

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

void cppnet::GetFormatTime(char *buf,uint32_t *len,FormatTimeUnit unit)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  ulong __maxlen;
  tm time;
  time_t now_time_t;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  now_time_t = lVar2 / 1000000000;
  Localtime((uint64_t *)&now_time_t,&time);
  __maxlen = (ulong)*len;
  uVar3 = (ulong)(time.tm_year + 0x76c);
  switch(unit) {
  case FTU_YEAR:
    uVar1 = snprintf(buf,__maxlen,"%04d",uVar3);
    break;
  case FTU_MONTH:
    uVar1 = snprintf(buf,__maxlen,"%04d-%02d",uVar3,(ulong)(time.tm_mon + 1));
    break;
  case FTU_DAY:
    uVar1 = snprintf(buf,__maxlen,"%04d-%02d-%02d",uVar3,(ulong)(time.tm_mon + 1),
                     (ulong)(uint)time.tm_mday);
    break;
  case FTU_HOUR:
    pcVar4 = "%04d-%02d-%02d:%02d";
    goto LAB_00113120;
  case FTU_MINUTE:
    pcVar4 = "%04d-%02d-%02d:%02d:%02d";
LAB_00113120:
    uVar1 = snprintf(buf,__maxlen,pcVar4,uVar3,(ulong)(time.tm_mon + 1),(ulong)(uint)time.tm_mday,
                     (ulong)(uint)time.tm_hour);
    break;
  case FTU_SECOND:
    pcVar4 = "%04d-%02d-%02d:%02d:%02d:%02d";
    goto LAB_00113156;
  default:
    pcVar4 = "%04d-%02d-%02d:%02d:%02d:%02d:%03d";
LAB_00113156:
    uVar1 = snprintf(buf,__maxlen,pcVar4,uVar3,(ulong)(time.tm_mon + 1),(ulong)(uint)time.tm_mday,
                     (ulong)(uint)time.tm_hour,(ulong)(uint)time.tm_min,(ulong)(uint)time.tm_sec);
  }
  *len = uVar1;
  return;
}

Assistant:

void GetFormatTime(char* buf, uint32_t& len, FormatTimeUnit unit) {
    auto now_time = std::chrono::system_clock::now();
    auto now_time_t = std::chrono::system_clock::to_time_t(now_time);
    
    int32_t millisecond = 0;
    if (unit == FTU_MILLISECOND) {
        auto msec = std::chrono::duration_cast<std::chrono::milliseconds>(now_time.time_since_epoch()).count();
        auto sec = std::chrono::duration_cast<std::chrono::seconds>(now_time.time_since_epoch()).count();
        millisecond = (int32_t)(msec - (sec * 1000));
    }
    
    tm time;
    Localtime((uint64_t*)&now_time_t, (void*)&time);
    switch (unit)
    {
    case FTU_MILLISECOND:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d:%03d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec, millisecond);
        break;
    case FTU_SECOND:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec);
        break;
    case FTU_MINUTE:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min);
        break;
    case FTU_HOUR:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour);
        break;
    case FTU_DAY:
        len = snprintf(buf, len, "%04d-%02d-%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday);
        break;
    case FTU_MONTH:
        len = snprintf(buf, len, "%04d-%02d", 1900 + time.tm_year,  1 + time.tm_mon);
        break;
    case FTU_YEAR:
        len = snprintf(buf, len, "%04d", 1900 + time.tm_year);
        break;
    default:
        // default FTU_MILLISECOND
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d:%03d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec, millisecond);
        break;
    }
}